

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HCrash.cpp
# Opt level: O1

void __thiscall HCrash::ltssf_iterate(HCrash *this,HModel *ptr_model)

{
  int *piVar1;
  int columnIn;
  int rowOut;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  
  this->n_crsh_ps = 0;
  this->n_crsh_bs_cg = 0;
  bVar6 = false;
  do {
    ltssf_cz_r(this);
    if ((long)this->cz_r_n == -1) {
      return;
    }
    this->cz_r_pri_v =
         (this->crsh_r_ty_pri_v).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start
         [(this->crsh_r_ty).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[this->cz_r_n]];
    ltssf_cz_c(this,ptr_model);
    columnIn = this->cz_c_n;
    if ((long)columnIn != -1) {
      this->n_crsh_bs_cg = this->n_crsh_bs_cg + 1;
      auVar7._0_8_ = this->mn_abs_pv_v;
      auVar7._8_8_ = this->mn_rlv_pv_v;
      auVar4._8_8_ = ABS(this->pv_v) /
                     (this->crsh_mtx_c_mx_abs_v).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start[columnIn];
      auVar4._0_8_ = ABS(this->pv_v);
      auVar7 = minpd(auVar7,auVar4);
      this->mn_abs_pv_v = (double)auVar7._0_8_;
      this->mn_rlv_pv_v = (double)auVar7._8_8_;
      rowOut = this->cz_r_n;
      iVar2 = this->numCol;
      HModel::updatePivots(this->model,columnIn,rowOut,1);
      if (this->model->mlFg_haveMatrixRowWise != 0) {
        HModel::updateMatrix(this->model,columnIn,iVar2 + rowOut);
      }
      piVar1 = (this->crsh_vr_ty_rm_n_r).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start +
               (this->crsh_r_ty).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[this->cz_r_n];
      *piVar1 = *piVar1 + 1;
      piVar1 = (this->crsh_vr_ty_add_n_c).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start +
               (this->crsh_c_ty).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[this->cz_c_n];
      *piVar1 = *piVar1 + 1;
    }
    ltssf_u_da(this,ptr_model);
    this->mx_r_pri = -1;
    uVar5 = 3;
    do {
      if ((this->crsh_r_pri_mn_r_k).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] <= this->numCol) {
        this->mx_r_pri = uVar5;
        break;
      }
      bVar3 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
    if ((this->alw_al_bs_cg == false) && (this->mx_c_pri + this->mx_r_pri < 4)) {
      printf(
            "Max active row priority of %d + Max original col priority of %d = %d <= %d: no value in performing further LTSSF crash\n"
            );
      bVar6 = true;
    }
    this->n_crsh_ps = this->n_crsh_ps + 1;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void HCrash::ltssf_iterate(HModel *ptr_model) {
  //	LTSSF Main loop
  n_crsh_ps = 0;
  n_crsh_bs_cg = 0;
  bool ltssf_stop = false;
  for (;;) {
    //		printf("\n LTSSF Crash pass %d\n", n_crsh_ps);
    //		ltssf_rp_r_pri();
    ltssf_cz_r();
    if (cz_r_n == no_ix)
      break;
    cz_r_pri_v = crsh_r_ty_pri_v[crsh_r_ty[cz_r_n]];
    ltssf_cz_c(ptr_model);
    bool bs_cg = cz_c_n != no_ix;
    if (bs_cg) {
      if (Rp_TwoD_da)
	printf("Pass %2d; cz_r = %2d; cz_c = %2d\n", n_crsh_ps, cz_r_n,
	       cz_c_n);
      //			A basis change has occurred
      n_crsh_bs_cg += 1;
      double abs_pv_v = abs(pv_v);
      double rlv_pv_v = abs_pv_v / crsh_mtx_c_mx_abs_v[cz_c_n];
      mn_abs_pv_v = min(abs_pv_v, mn_abs_pv_v);
      mn_rlv_pv_v = min(rlv_pv_v, mn_rlv_pv_v);
      int columnIn = cz_c_n;
      int rowOut = cz_r_n;
      int columnOut = numCol + cz_r_n;
      int sourceOut = 1;
      //			Update the basic/nonbasic variable info and the row-wise copy of the matrix
      model->updatePivots(columnIn, rowOut, sourceOut);
      if (model->mlFg_haveMatrixRowWise)
	model->updateMatrix(columnIn, columnOut);
      //		    Update the count of this type of removal and addition
      int vr_ty = crsh_r_ty[cz_r_n];
      crsh_vr_ty_rm_n_r[vr_ty] += 1;
      vr_ty = crsh_c_ty[cz_c_n];
      crsh_vr_ty_add_n_c[vr_ty] += 1;
    } else {
      if (Rp_TwoD_da) printf("Pass %2d; cz_r = %2d: No basis change\n", n_crsh_ps, cz_r_n);
    }
    if (Rp_TwoD_da) ltssf_rp_pri_k_da();
    ltssf_u_da(ptr_model);
    //for (int r_n = 0; r_n < numRow; r_n++) {
    //if (crsh_act_r[r_n] != 0)
    //printf("Row %2d , Pri = %1d; K = %2d\n", r_n, crsh_r_ty_pri_v[crsh_r_ty[r_n]], crsh_r_k[r_n]);
    //}
    //Check LTSSF data every ltssf_ck_fq passes (if ltssf_ck_fq>0)
    if ((ltssf_ck_fq > 0) && (n_crsh_ps % ltssf_ck_fq == 0)) ltssf_ck_da();
    if (Rp_TwoD_da) ltssf_rp_pri_k_da();
    if (TwoD_hdr) {
      //			Determine whether the are still rows worth removing
      mx_r_pri = crsh_mn_pri_v - 1;
      for (int pri_v = crsh_mx_pri_v; pri_v > crsh_mn_pri_v; pri_v--) {
	if (crsh_r_pri_mn_r_k[pri_v] < numCol + 1) {
	  mx_r_pri = pri_v;
	  break;
	}
      }
      if ((!alw_al_bs_cg) && (mx_r_pri + mx_c_pri <= crsh_mx_pri_v)) {
	printf("Max active row priority of %d + Max original col priority of %d = %d <= %d: no value in performing further LTSSF crash\n",
	       mx_r_pri, mx_c_pri, mx_r_pri + mx_c_pri, crsh_mx_pri_v);
	ltssf_stop = true;
      }
    }
    
    n_crsh_ps += 1;
    if (ltssf_stop) break;
    //if (n_crsh_ps==6) break;
  }
}